

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcat_s.c
# Opt level: O1

int main(void)

{
  return 0;
}

Assistant:

int main( void )
{
#if ! defined( REGTEST ) || defined( __STDC_LIB_EXT1__ )
    char s[] = "xx\0xxxxxx";
    set_constraint_handler_s( test_handler );

    TESTCASE( strcat_s( s, 10, abcde ) == 0 );
    TESTCASE( s[2] == 'a' );
    TESTCASE( s[6] == 'e' );
    TESTCASE( s[7] == '\0' );
    TESTCASE( s[8] == 'x' );
    s[0] = '\0';
    TESTCASE( strcat_s( s, 10, abcdx ) == 0 );
    TESTCASE( s[4] == 'x' );
    TESTCASE( s[5] == '\0' );
    TESTCASE( strcat_s( s, 10, "\0" ) == 0 );
    TESTCASE( s[5] == '\0' );
    TESTCASE( s[6] == 'e' );

    TESTCASE( strcat_s( s, 6, "" ) == 0 );
    TESTCASE( strcat_s( s, 5, "" ) != 0 );
    TESTCASE( strcat_s( s, 7, "x" ) == 0 );
    TESTCASE( s[5] == 'x' );
    TESTCASE( s[6] == '\0' );

    /* Overlapping */
    TESTCASE( strcat_s( s, 7, s + 6 ) != 0 );
    s[3] = '\0';
    TESTCASE( strcat_s( s + 3, 4, s ) != 0 );

    TESTCASE( HANDLER_CALLS == 3 );
#endif
    return TEST_RESULTS;
}